

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

Maybe<kj::AutoCloseFd> * __thiscall
kj::anon_unknown_8::DiskHandle::tryOpenSubdirInternal
          (Maybe<kj::AutoCloseFd> *__return_storage_ptr__,DiskHandle *this,PathPtr path)

{
  PathPtr path_00;
  undefined1 auVar1 [8];
  size_t sVar2;
  bool bVar3;
  int iVar4;
  int code;
  AutoCloseFd __file;
  AutoCloseFd result;
  undefined1 local_58 [8];
  size_t sStack_50;
  ArrayDisposer *local_48;
  PathPtr local_40;
  
  local_40.parts.size_ = path.parts.size_;
  local_40.parts.ptr = path.parts.ptr;
  do {
    iVar4 = (this->fd).fd;
    PathPtr::toString((String *)local_58,&local_40,false);
    __file = (AutoCloseFd)((long)"\n\n" + 2);
    if (sStack_50 != 0) {
      __file = (AutoCloseFd)local_58;
    }
    iVar4 = openat(iVar4,(char *)__file,0x90000);
    sVar2 = sStack_50;
    auVar1 = local_58;
    if ((AutoCloseFd)local_58 != (AutoCloseFd)0x0) {
      local_58._0_4_ = 0;
      local_58._4_4_ = 0;
      sStack_50 = 0;
      (**local_48->_vptr_ArrayDisposer)(local_48,auVar1,1,sVar2,sVar2,0);
    }
    if (-1 < iVar4) {
      code = 0;
      break;
    }
    code = kj::_::Debug::getOsErrorNumber(false);
  } while (code == -1);
  if (code == 0) {
    local_58._0_4_ = iVar4;
    UnwindDetector::UnwindDetector((UnwindDetector *)(local_58 + 4));
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.fd = local_58._0_4_;
    UnwindDetector::UnwindDetector(&(__return_storage_ptr__->ptr).field_1.value.unwindDetector);
    local_58._0_4_ = -1;
    AutoCloseFd::~AutoCloseFd((AutoCloseFd *)local_58);
    return __return_storage_ptr__;
  }
  if (code == 0x14) {
    path_00.parts.size_ = local_40.parts.size_;
    path_00.parts.ptr = local_40.parts.ptr;
    bVar3 = exists(this,path_00);
    if (bVar3) goto LAB_00258d1b;
  }
  else if (code != 2) {
LAB_00258d1b:
    kj::_::Debug::Fault::Fault<int,kj::PathPtr&>
              ((Fault *)local_58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x303,code,"openat(fd, path, O_DIRECTORY)","path",&local_40);
    (__return_storage_ptr__->ptr).isSet = false;
    kj::_::Debug::Fault::~Fault((Fault *)local_58);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->ptr).isSet = false;
  return __return_storage_ptr__;
}

Assistant:

Maybe<AutoCloseFd> tryOpenSubdirInternal(PathPtr path) const {
    int newFd;
    KJ_SYSCALL_HANDLE_ERRORS(newFd = openat(
        fd, path.toString().cStr(), O_RDONLY | MAYBE_O_CLOEXEC | MAYBE_O_DIRECTORY)) {
      case ENOENT:
        return nullptr;
      case ENOTDIR:
        // Could mean that a parent is not a directory, which we treat as "doesn't exist".
        // Could also mean that the specified file is not a directory, which should throw.
        // Check using exists().
        if (!exists(path)) {
          return nullptr;
        }
        // fallthrough
      default:
        KJ_FAIL_SYSCALL("openat(fd, path, O_DIRECTORY)", error, path) { return nullptr; }
    }

    kj::AutoCloseFd result(newFd);
#ifndef O_CLOEXEC
    setCloexec(result);
#endif

    return kj::mv(result);
  }